

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O0

Var Js::JavascriptReflect::EntryConstruct(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar7;
  Var pvVar8;
  CallInfo local_130;
  Entry *local_f0;
  Var argArray;
  RecyclableObject *thisArg;
  Var newTarget;
  Var target;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  Var undefinedValue;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x172,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetLibrary(pSVar5);
  __tag.entry.next =
       (Entry *)JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)function_local,
             L"Reflect.construct",&stack0x00000000);
  if (((uint)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x177,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CVar3 = Js::operator&((uint)scriptContext >> 0x18,CallFlags_New);
  if (CVar3 != CallFlags_None) {
    JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ebf5,L"Reflect.construct");
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    local_f0 = __tag.entry.next;
  }
  else {
    local_f0 = (Entry *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  bVar2 = Js::JavascriptOperators::IsConstructor(local_f0);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea05,L"target");
  }
  if (((uint)scriptContext & 0xffffff) < 4) {
    thisArg = (RecyclableObject *)local_f0;
  }
  else {
    thisArg = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,3);
    bVar2 = Js::JavascriptOperators::IsConstructor(thisArg);
    if (!bVar2) {
      JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea05,L"newTarget");
    }
  }
  argArray = VarTo<Js::RecyclableObject>(__tag.entry.next);
  if (thisArg != (RecyclableObject *)0x0) {
    pRVar7 = VarTo<Js::RecyclableObject>(thisArg);
    argArray = Js::JavascriptOperators::CreateFromConstructor(pRVar7,pSVar5);
  }
  if (((uint)scriptContext & 0xffffff) < 3) {
    local_130 = (CallInfo)__tag.entry.next;
  }
  else {
    local_130 = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,2);
  }
  if (local_130 == (CallInfo)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x199,"(argArray != nullptr)","argArray != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  callInfo_local = local_130;
  if (local_130 == (CallInfo)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is((Var)callInfo_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar7);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  BVar4 = Js::JavascriptOperators::IsObjectType(local_18);
  if (BVar4 != 0) {
    pRVar7 = VarTo<Js::RecyclableObject>(local_f0);
    pvVar8 = JavascriptFunction::ConstructHelper(pRVar7,argArray,thisArg,(Var)local_130,pSVar5);
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_90);
    return pvVar8;
  }
  JavascriptError::ThrowTypeError(pSVar5,-0x7ff5e9dc,L"Reflect.construct");
}

Assistant:

Var JavascriptReflect::EntryConstruct(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.construct"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.construct"));
        }

        Var target = args.Info.Count > 1 ? args[1] : undefinedValue;

        if (!JavascriptOperators::IsConstructor(target))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("target"));
        }

        Var newTarget = nullptr;
        if (args.Info.Count > 3)
        {
            newTarget = args[3];
            if (!JavascriptOperators::IsConstructor(newTarget))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("newTarget"));
            }
        }
        else
        {
            newTarget = target;
        }

        RecyclableObject* thisArg = VarTo<RecyclableObject>(undefinedValue);
        if (newTarget != nullptr)
        {
            thisArg = JavascriptOperators::CreateFromConstructor(VarTo<RecyclableObject>(newTarget), scriptContext);
        }

        Var argArray = args.Info.Count > 2 ? args[2] : undefinedValue;
        AnalysisAssert(argArray != nullptr);
        if (!(JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(argArray))))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedArrayLike, _u("Reflect.construct"));
        }

        return JavascriptFunction::ConstructHelper(VarTo<RecyclableObject>(target), thisArg, newTarget, argArray, scriptContext);
    }